

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsignalspy.cpp
# Opt level: O0

int __thiscall
QSignalSpyPrivate::qt_metacall(QSignalSpyPrivate *this,Call call,int methodId,void **a)

{
  uint in_EDX;
  int in_ESI;
  Call in_EDI;
  QSignalSpy *in_stack_00000020;
  undefined4 local_18;
  undefined4 local_4;
  
  local_18 = QObject::qt_metacall(in_EDI,in_ESI,(void **)(ulong)in_EDX);
  local_4 = local_18;
  if (-1 < local_18) {
    if (in_ESI == 0) {
      if (local_18 == 0) {
        QSignalSpy::appendArgs(in_stack_00000020,(void **)this);
      }
      local_18 = local_18 + -1;
    }
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

int QSignalSpyPrivate::qt_metacall(QMetaObject::Call call, int methodId, void **a)
{
    methodId = QObject::qt_metacall(call, methodId, a);
    if (methodId < 0)
        return methodId;

    if (call == QMetaObject::InvokeMetaMethod) {
        if (methodId == 0) {
            q->appendArgs(a);
        }
        --methodId;
    }
    return methodId;
}